

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool,false,true>
               (interval_t *ldata,timestamp_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  unsigned_long *puVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  timestamp_t tVar8;
  timestamp_t tVar9;
  ulong uVar10;
  int64_t *piVar11;
  ulong uVar12;
  idx_t iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  int64_t *local_68;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      tVar9 = (timestamp_t)rdata->value;
      local_68 = &ldata->micros;
      iVar13 = 0;
      do {
        uVar3 = ((interval_t *)(local_68 + -1))->months;
        uVar7 = ((interval_t *)(local_68 + -1))->days;
        right_01.days = uVar7;
        right_01.months = uVar3;
        right_01.micros = *local_68;
        tVar8 = Interval::Add(tVar9,right_01);
        result_data[iVar13].value = tVar8.value;
        iVar13 = iVar13 + 1;
        local_68 = local_68 + 2;
      } while (count != iVar13);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar10 = 0;
    uVar15 = 0;
    do {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        uVar14 = 0xffffffffffffffff;
      }
      else {
        uVar14 = puVar4[uVar10];
      }
      uVar16 = uVar15 + 0x40;
      if (count <= uVar15 + 0x40) {
        uVar16 = count;
      }
      uVar12 = uVar16;
      if (uVar14 != 0) {
        uVar12 = uVar15;
        if (uVar14 == 0xffffffffffffffff) {
          if (uVar15 < uVar16) {
            tVar9 = (timestamp_t)rdata->value;
            piVar11 = &ldata[uVar15].micros;
            do {
              uVar1 = ((interval_t *)(piVar11 + -1))->months;
              uVar5 = ((interval_t *)(piVar11 + -1))->days;
              right.days = uVar5;
              right.months = uVar1;
              right.micros = *piVar11;
              tVar8 = Interval::Add(tVar9,right);
              result_data[uVar15].value = tVar8.value;
              uVar15 = uVar15 + 1;
              piVar11 = piVar11 + 2;
              uVar12 = uVar15;
            } while (uVar16 != uVar15);
          }
        }
        else if (uVar15 < uVar16) {
          piVar11 = &ldata[uVar15].micros;
          uVar12 = 0;
          do {
            if ((uVar14 >> (uVar12 & 0x3f) & 1) != 0) {
              uVar2 = ((interval_t *)(piVar11 + -1))->months;
              uVar6 = ((interval_t *)(piVar11 + -1))->days;
              right_00.days = uVar6;
              right_00.months = uVar2;
              right_00.micros = *piVar11;
              tVar9 = Interval::Add(rdata->value,right_00);
              result_data[uVar15 + uVar12].value = tVar9.value;
            }
            uVar12 = uVar12 + 1;
            piVar11 = piVar11 + 2;
          } while ((uVar15 - uVar16) + uVar12 != 0);
          uVar12 = uVar15 + uVar12;
        }
      }
      uVar10 = uVar10 + 1;
      uVar15 = uVar12;
    } while (uVar10 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}